

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::
init<Kernel::TypedTermList>(GenMatcher *this,TypedTermList query,uint nextSpecVar)

{
  uint uVar1;
  size_t sVar2;
  uint in_ECX;
  DArray<Kernel::TermList> *in_RSI;
  Stack<unsigned_int> *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  Stack<unsigned_int> *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_1c [3];
  DArray<Kernel::TermList> *local_10;
  
  local_1c[0] = in_ECX;
  local_10 = in_RSI;
  Lib::Stack<unsigned_int>::reset(in_RDI);
  Lib::ArrayMap<Kernel::TermList>::reset((ArrayMap<Kernel::TermList> *)(in_RDI + 2));
  uVar1 = weight((TermList)0x3f4dd8);
  *(uint *)&in_RDI[1]._end = uVar1 - 1;
  sVar2 = Lib::DArray<Kernel::TermList>::size((DArray<Kernel::TermList> *)(in_RDI + 1));
  if (sVar2 < local_1c[0]) {
    sVar2 = Lib::DArray<Kernel::TermList>::size((DArray<Kernel::TermList> *)(in_RDI + 1));
    uVar1 = (uint)(sVar2 << 1);
    std::max<unsigned_int>((uint *)&stack0xffffffffffffffd4,local_1c);
    Lib::DArray<Kernel::TermList>::ensure(local_10,CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  }
  this_00 = in_RDI + 2;
  weight((TermList)0x3f4e55);
  Lib::ArrayMap<Kernel::TermList>::ensure
            ((ArrayMap<Kernel::TermList> *)this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void init(TermOrLit query, unsigned nextSpecVar)
      {
        _boundVars.reset();
        // _specVars->reset(); <- does not need to be reset as we only write before we read 
        _bindings.reset();

        _maxVar = weight(query) - 1;
        if(_specVars.size()<nextSpecVar) {
          //_specVars can get really big, but it was introduced instead of hash table
          //during optimizations, as it raised performance by abour 5%.
          _specVars.ensure(std::max(static_cast<unsigned>(_specVars.size()*2), nextSpecVar));
        }
        _bindings.ensure(weight(query));
      }